

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_key_encode_decode.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_a3d2::do_encode_bytes_test
          (anon_unknown_dwarf_a3d2 *this,span<const_std::byte,_18446744073709551615UL> a)

{
  span<const_std::byte,_18446744073709551615UL> data;
  bool bVar1;
  pointer __s1;
  pointer __s2;
  char *pcVar2;
  AssertHelper local_1b8;
  Message local_1b0;
  size_t local_1a8;
  undefined1 local_1a0 [8];
  AssertionResult gtest_ar_1;
  Message local_188;
  int local_17c;
  undefined1 local_178 [8];
  AssertionResult gtest_ar;
  int local_158 [2];
  int cmp;
  size_t local_148;
  size_t sStack_140;
  size_type local_138;
  size_type sz;
  key_encoder enc;
  span<const_std::byte,_18446744073709551615UL> a_local;
  
  enc.off = (size_t)this;
  unodb::key_encoder::key_encoder((key_encoder *)&sz);
  local_138 = std::span<const_std::byte,_18446744073709551615UL>::size
                        ((span<const_std::byte,_18446744073709551615UL> *)&enc.off);
  local_148 = enc.off;
  data._M_extent._M_extent_value = (size_t)a._M_ptr;
  data._M_ptr = (pointer)enc.off;
  sStack_140 = (size_t)a._M_ptr;
  unodb::key_encoder::append_bytes((key_encoder *)&sz,data);
  join_0x00000010_0x00000000_ = unodb::key_encoder::get_key_view((key_encoder *)&sz);
  __s1 = std::span<const_std::byte,_18446744073709551615UL>::data
                   ((span<const_std::byte,_18446744073709551615UL> *)&gtest_ar.message_);
  __s2 = std::span<const_std::byte,_18446744073709551615UL>::data
                   ((span<const_std::byte,_18446744073709551615UL> *)&enc.off);
  local_158[0] = memcmp(__s1,__s2,local_138);
  local_17c = 0;
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((EqHelper *)local_178,"(0)","(cmp)",&local_17c,local_158);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_178);
  if (!bVar1) {
    testing::Message::Message(&local_188);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_178);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/test/test_key_encode_decode.cpp"
               ,0x26c,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,&local_188);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(&local_188);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_178);
  local_1a8 = unodb::key_encoder::size_bytes((key_encoder *)&sz);
  testing::internal::EqHelper::Compare<unsigned_long,_unsigned_long,_nullptr>
            ((EqHelper *)local_1a0,"(sz)","(enc.size_bytes())",&local_138,&local_1a8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1a0);
  if (!bVar1) {
    testing::Message::Message(&local_1b0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_1a0);
    testing::internal::AssertHelper::AssertHelper
              (&local_1b8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/test/test_key_encode_decode.cpp"
               ,0x26d,pcVar2);
    testing::internal::AssertHelper::operator=(&local_1b8,&local_1b0);
    testing::internal::AssertHelper::~AssertHelper(&local_1b8);
    testing::Message::~Message(&local_1b0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1a0);
  unodb::key_encoder::~key_encoder((key_encoder *)&sz);
  return;
}

Assistant:

void do_encode_bytes_test(std::span<const std::byte> a) {
  unodb::key_encoder enc;
  const auto sz = a.size();
  enc.append_bytes(a);
  const auto cmp = std::memcmp(enc.get_key_view().data(), a.data(), sz);
  UNODB_EXPECT_EQ(0, cmp);
  UNODB_EXPECT_EQ(sz, enc.size_bytes());
}